

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall spvtools::opt::CFG::CFG(CFG *this,Module *module)

{
  Module *this_00;
  bool bVar1;
  Instruction *pIVar2;
  IRContext *pIVar3;
  reference this_01;
  reference blk_00;
  value_type *blk;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  value_type *fn;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  Module *local_18;
  Module *module_local;
  CFG *this_local;
  
  this->module_ = module;
  local_18 = module;
  module_local = (Module *)this;
  std::
  unordered_map<const_spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>_>
  ::unordered_map(&this->block2structured_succs_);
  pIVar2 = (Instruction *)::operator_new(0x70);
  pIVar3 = Module::context(local_18);
  memset(&local_38,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector(&local_38);
  opt::Instruction::Instruction(pIVar2,pIVar3,OpLabel,0,0,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_20,pIVar2);
  BasicBlock::BasicBlock(&this->pseudo_entry_block_,&local_20);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  pIVar2 = (Instruction *)::operator_new(0x70);
  pIVar3 = Module::context(local_18);
  memset(&__range2,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&__range2);
  opt::Instruction::Instruction(pIVar2,pIVar3,OpLabel,0,0x400000,(OperandList *)&__range2);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_40,pIVar2);
  BasicBlock::BasicBlock(&this->pseudo_exit_block_,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_40);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&__range2);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->label2preds_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
  ::unordered_map(&this->id2block_);
  this_00 = local_18;
  join_0x00000010_0x00000000_ = Module::begin(local_18);
  _fn = Module::end(this_00);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&fn);
    if (!bVar1) break;
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    join_0x00000010_0x00000000_ = opt::Function::begin(this_01);
    _blk = opt::Function::end(this_01);
    while( true ) {
      bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_,
                         (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&blk);
      if (!bVar1) break;
      blk_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_)
      ;
      RegisterBlock(this,blk_00);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  return;
}

Assistant:

CFG::CFG(Module* module)
    : module_(module),
      pseudo_entry_block_(std::unique_ptr<Instruction>(
          new Instruction(module->context(), spv::Op::OpLabel, 0, 0, {}))),
      pseudo_exit_block_(std::unique_ptr<Instruction>(new Instruction(
          module->context(), spv::Op::OpLabel, 0, kMaxResultId, {}))) {
  for (auto& fn : *module) {
    for (auto& blk : fn) {
      RegisterBlock(&blk);
    }
  }
}